

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiAreaPrivate::rearrange(QMdiAreaPrivate *this,Rearranger *rearranger)

{
  long lVar1;
  int iVar2;
  QWidget *this_00;
  QWidgetData *pQVar3;
  undefined1 auVar4 [16];
  long lVar5;
  QMdiSubWindow **ppQVar6;
  bool bVar7;
  int iVar8;
  QSize QVar9;
  Representation RVar10;
  long in_RCX;
  QList<QMdi::Rearranger_*> *this_01;
  long lVar11;
  long lVar12;
  long in_FS_OFFSET;
  QSize minSubWindowSize;
  QRect local_98;
  QSize local_80;
  QList<QMdiSubWindow_*> local_78;
  QArrayData *local_58;
  undefined8 uStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (rearranger != (Rearranger *)0x0) {
    if ((*(byte *)(*(long *)(*(long *)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                       super_QWidgetPrivate.field_0x8 + 0x20) + 9) & 0x80) == 0) {
      lVar11 = (this->pendingRearrangements).d.size;
      if (lVar11 == 0) {
LAB_00448819:
        iVar8 = -1;
      }
      else {
        lVar12 = -8;
        do {
          iVar8 = (int)in_RCX;
          lVar1 = lVar11 * -8 + lVar12;
          if (lVar1 == -8) goto LAB_00448813;
          in_RCX = lVar12 + 8;
          lVar5 = lVar12 + 8;
          lVar12 = in_RCX;
        } while (*(Rearranger **)((long)(this->pendingRearrangements).d.ptr + lVar5) != rearranger);
        iVar8 = (int)(in_RCX >> 3);
LAB_00448813:
        if (lVar1 == -8) goto LAB_00448819;
      }
      this_01 = &this->pendingRearrangements;
      if (iVar8 != -1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          QList<QMdi::Rearranger_*>::move(this_01,(long)iVar8,lVar11 + -1);
          return;
        }
        goto LAB_00448b40;
      }
      local_58 = (QArrayData *)rearranger;
      QtPrivate::QPodArrayOps<QMdi::Rearranger*>::emplace<QMdi::Rearranger*&>
                ((QPodArrayOps<QMdi::Rearranger*> *)this_01,lVar11,(Rearranger **)&local_58);
      QList<QMdi::Rearranger_*>::end(this_01);
    }
    else {
      local_58 = (QArrayData *)0x0;
      uStack_50 = 0;
      local_48 = 0;
      iVar8 = (*rearranger->_vptr_Rearranger[1])(rearranger);
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (QMdiSubWindow **)&DAT_aaaaaaaaaaaaaaaa;
      subWindowList(&local_78,this,this->activationOrder,iVar8 == 0);
      ppQVar6 = local_78.d.ptr;
      local_80.wd.m_i = -1;
      local_80.ht.m_i = -1;
      if ((undefined1 *)local_78.d.size != (undefined1 *)0x0) {
        lVar11 = local_78.d.size << 3;
        lVar12 = 0;
        do {
          this_00 = *(QWidget **)((long)ppQVar6 + lVar12);
          bVar7 = sanityCheck((QMdiSubWindow *)this_00,"QMdiArea::rearrange");
          if ((bVar7) && ((this_00->data->widget_attributes & 0x8000) != 0)) {
            iVar8 = (*rearranger->_vptr_Rearranger[1])();
            bVar7 = QWidget::isMinimized(this_00);
            if (iVar8 == 2) {
              if (bVar7) {
                bVar7 = QMdiSubWindow::isShaded((QMdiSubWindow *)this_00);
                if (!bVar7) goto LAB_004489bb;
              }
            }
            else if ((!bVar7) || (bVar7 = QMdiSubWindow::isShaded((QMdiSubWindow *)this_00), bVar7))
            {
              bVar7 = QWidget::isMaximized(this_00);
              if ((bVar7) || (bVar7 = QMdiSubWindow::isShaded((QMdiSubWindow *)this_00), bVar7)) {
                QWidget::showNormal(this_00);
              }
              QVar9 = QWidget::minimumSize(this_00);
              if (local_80.wd.m_i <= QVar9.wd.m_i.m_i) {
                local_80.wd.m_i = QVar9.wd.m_i.m_i;
              }
              RVar10.m_i = QVar9.ht.m_i.m_i;
              if (QVar9.ht.m_i.m_i < local_80.ht.m_i) {
                RVar10.m_i = local_80.ht.m_i;
              }
              iVar8 = *(int *)(*(long *)&this_00->field_0x8 + 0x2b8);
              iVar2 = *(int *)(*(long *)&this_00->field_0x8 + 700);
              if (local_80.wd.m_i <= iVar8) {
                local_80.wd.m_i = iVar8;
              }
              if (RVar10.m_i <= iVar2) {
                RVar10.m_i = iVar2;
              }
              local_80.ht.m_i = RVar10.m_i;
LAB_004489bb:
              local_98._0_8_ = this_00;
              QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                        ((QPodArrayOps<QWidget*> *)&local_58,local_48,(QWidget **)&local_98);
              QList<QWidget_*>::end((QList<QWidget_*> *)&local_58);
            }
          }
          lVar12 = lVar12 + 8;
        } while (lVar11 != lVar12);
      }
      pQVar3 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
      auVar4._4_4_ = (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i;
      auVar4._0_4_ = (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i;
      auVar4._8_8_ = 0;
      local_98 = (QRect)(auVar4 << 0x40);
      iVar8 = (*rearranger->_vptr_Rearranger[1])(rearranger);
      if ((iVar8 == 0) && (local_48 != 0)) {
        local_98 = resizeToMinimumTileSize(this,&local_80,(int)local_48);
      }
      (**rearranger->_vptr_Rearranger)(rearranger,&local_58,&local_98);
      iVar8 = (*rearranger->_vptr_Rearranger[1])(rearranger);
      if ((iVar8 == 0) && (local_48 != 0)) {
        this->isSubWindowsTiled = true;
        updateScrollBars(this);
      }
      else {
        iVar8 = (*rearranger->_vptr_Rearranger[1])(rearranger);
        if (iVar8 == 1) {
          this->isSubWindowsTiled = false;
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,8,0x10);
        }
      }
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,8,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00448b40:
  __stack_chk_fail();
}

Assistant:

void QMdiAreaPrivate::rearrange(Rearranger *rearranger)
{
    if (!rearranger)
        return;

    Q_Q(QMdiArea);
    if (!q->isVisible()) {
        // Compress if we already have the rearranger in the list.
        int index = pendingRearrangements.indexOf(rearranger);
        if (index != -1)
            pendingRearrangements.move(index, pendingRearrangements.size() - 1);
        else
            pendingRearrangements.append(rearranger);
        return;
    }

    QList<QWidget *> widgets;
    const bool reverseList = rearranger->type() == Rearranger::RegularTiler;
    const QList<QMdiSubWindow *> subWindows = subWindowList(activationOrder, reverseList);
    QSize minSubWindowSize;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::rearrange") || !child->isVisible())
            continue;
        if (rearranger->type() == Rearranger::IconTiler) {
            if (child->isMinimized() && !child->isShaded())
                widgets.append(child);
        } else {
            if (child->isMinimized() && !child->isShaded())
                continue;
            if (child->isMaximized() || child->isShaded())
                child->showNormal();
            minSubWindowSize = minSubWindowSize.expandedTo(child->minimumSize())
                               .expandedTo(child->d_func()->internalMinimumSize);
            widgets.append(child);
        }
    }

    QRect domain = viewport->rect();
    if (rearranger->type() == Rearranger::RegularTiler && !widgets.isEmpty())
        domain = resizeToMinimumTileSize(minSubWindowSize, widgets.size());

    rearranger->rearrange(widgets, domain);

    if (rearranger->type() == Rearranger::RegularTiler && !widgets.isEmpty()) {
        isSubWindowsTiled = true;
        updateScrollBars();
    } else if (rearranger->type() == Rearranger::SimpleCascader) {
        isSubWindowsTiled = false;
    }
}